

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

int __thiscall
testing::internal::UnitTestImpl::FilterTests(UnitTestImpl *this,ReactionToSharding shard_tests)

{
  TestSuite *pTVar1;
  pointer ppTVar2;
  TestInfo *pTVar3;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  bool bVar10;
  allocator<char> local_8d;
  int32_t local_8c;
  int32_t local_88;
  ReactionToSharding local_84;
  pointer local_80;
  pointer local_78;
  string test_name;
  string local_50;
  
  local_84 = shard_tests;
  if (shard_tests == HONOR_SHARDING_PROTOCOL) {
    local_88 = Int32FromEnvOrDie("GTEST_TOTAL_SHARDS",-1);
    local_8c = Int32FromEnvOrDie("GTEST_SHARD_INDEX",-1);
  }
  else {
    local_8c = -1;
    local_88 = local_8c;
  }
  local_80 = (this->test_suites_).
             super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl
             .super__Vector_impl_data._M_finish;
  iVar9 = 0;
  iVar7 = 0;
  for (local_78 = (this->test_suites_).
                  super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; local_78 != local_80;
      local_78 = local_78 + 1) {
    pTVar1 = *local_78;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,(pTVar1->name_)._M_dataplus._M_p,(allocator<char> *)&test_name);
    pTVar1->should_run_ = false;
    for (uVar8 = 0;
        ppTVar2 = (pTVar1->test_info_list_).
                  super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                  _M_impl.super__Vector_impl_data._M_start,
        uVar8 < (ulong)((long)(pTVar1->test_info_list_).
                              super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar2 >> 3);
        uVar8 = uVar8 + 1) {
      pTVar3 = ppTVar2[uVar8];
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&test_name,(pTVar3->name_)._M_dataplus._M_p,&local_8d);
      bVar4 = UnitTestOptions::MatchesFilter(&local_50,"DISABLED_*:*/DISABLED_*");
      bVar5 = true;
      if (!bVar4) {
        bVar5 = UnitTestOptions::MatchesFilter(&test_name,"DISABLED_*:*/DISABLED_*");
      }
      pTVar3->is_disabled_ = bVar5;
      bVar4 = UnitTestOptions::FilterMatchesTest(&local_50,&test_name);
      pTVar3->matches_filter_ = bVar4;
      bVar10 = iVar7 % local_88 != local_8c;
      bVar6 = bVar4 & (bVar5 ^ 1U | FLAGS_gtest_also_run_disabled_tests);
      pTVar3->is_in_another_shard_ = local_84 != IGNORE_SHARDING_PROTOCOL && bVar10;
      bVar4 = (bool)((local_84 == IGNORE_SHARDING_PROTOCOL || !bVar10) & bVar6);
      iVar7 = iVar7 + (uint)bVar6;
      iVar9 = iVar9 + (uint)bVar4;
      pTVar3->should_run_ = bVar4;
      pTVar1->should_run_ = (bool)(pTVar1->should_run_ | bVar4);
      std::__cxx11::string::~string((string *)&test_name);
    }
    std::__cxx11::string::~string((string *)&local_50);
  }
  return iVar9;
}

Assistant:

int UnitTestImpl::FilterTests(ReactionToSharding shard_tests) {
  const int32_t total_shards = shard_tests == HONOR_SHARDING_PROTOCOL ?
      Int32FromEnvOrDie(kTestTotalShards, -1) : -1;
  const int32_t shard_index = shard_tests == HONOR_SHARDING_PROTOCOL ?
      Int32FromEnvOrDie(kTestShardIndex, -1) : -1;

  // num_runnable_tests are the number of tests that will
  // run across all shards (i.e., match filter and are not disabled).
  // num_selected_tests are the number of tests to be run on
  // this shard.
  int num_runnable_tests = 0;
  int num_selected_tests = 0;
  for (auto* test_suite : test_suites_) {
    const std::string& test_suite_name = test_suite->name();
    test_suite->set_should_run(false);

    for (size_t j = 0; j < test_suite->test_info_list().size(); j++) {
      TestInfo* const test_info = test_suite->test_info_list()[j];
      const std::string test_name(test_info->name());
      // A test is disabled if test suite name or test name matches
      // kDisableTestFilter.
      const bool is_disabled = internal::UnitTestOptions::MatchesFilter(
                                   test_suite_name, kDisableTestFilter) ||
                               internal::UnitTestOptions::MatchesFilter(
                                   test_name, kDisableTestFilter);
      test_info->is_disabled_ = is_disabled;

      const bool matches_filter = internal::UnitTestOptions::FilterMatchesTest(
          test_suite_name, test_name);
      test_info->matches_filter_ = matches_filter;

      const bool is_runnable =
          (GTEST_FLAG_GET(also_run_disabled_tests) || !is_disabled) &&
          matches_filter;

      const bool is_in_another_shard =
          shard_tests != IGNORE_SHARDING_PROTOCOL &&
          !ShouldRunTestOnShard(total_shards, shard_index, num_runnable_tests);
      test_info->is_in_another_shard_ = is_in_another_shard;
      const bool is_selected = is_runnable && !is_in_another_shard;

      num_runnable_tests += is_runnable;
      num_selected_tests += is_selected;

      test_info->should_run_ = is_selected;
      test_suite->set_should_run(test_suite->should_run() || is_selected);
    }
  }
  return num_selected_tests;
}